

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffainit(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  char errmsg [81];
  char message [81];
  char comm [73];
  char value [71];
  char name [75];
  tcolumn *colptr;
  LONGLONG tbcoln;
  LONGLONG nrows;
  LONGLONG rowlen;
  LONGLONG pcount;
  long tfield;
  int ntilebins;
  int nspace;
  int ii;
  long *in_stack_fffffffffffffde8;
  LONGLONG *in_stack_fffffffffffffdf0;
  LONGLONG *in_stack_fffffffffffffdf8;
  LONGLONG *in_stack_fffffffffffffe00;
  fitsfile *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffeb0;
  char in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffeb9;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  fitsfile *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  char local_f8 [80];
  char local_a8 [80];
  undefined1 *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  size_t local_30;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  int *local_10;
  
  local_58 = (undefined1 *)0x0;
  if (0 < *in_RSI) {
    return *in_RSI;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,
           in_stack_fffffffffffffe50);
  }
  *(undefined4 *)(*(long *)(local_10 + 2) + 0x58) = 1;
  *(undefined8 *)(*(long *)(local_10 + 2) + 0x70) = *(undefined8 *)(*(long *)(local_10 + 2) + 0x30);
  iVar1 = ffgttb(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)0x16c2ff);
  if (0 < iVar1) {
    return *local_18;
  }
  if (local_38 != 0) {
    ffpmsg((char *)0x16c331);
    snprintf(&stack0xfffffffffffffdf8,0x51,"  PCOUNT = %ld",local_38);
    ffpmsg((char *)0x16c35b);
    *local_18 = 0xd6;
    return 0xd6;
  }
  *(long *)(*(long *)(local_10 + 2) + 0x3c8) = local_40;
  *(int *)(*(long *)(local_10 + 2) + 0x3b0) = (int)local_30;
  if (*(long *)(*(long *)(local_10 + 2) + 0x530) != 0) {
    local_24 = (int)((*(long *)(*(long *)(local_10 + 2) + 0x498) + -1) /
                    *(long *)(*(long *)(local_10 + 2) + 0x440)) + 1;
    for (local_1c = 0; local_1c < local_24; local_1c = local_1c + 1) {
      if (*(long *)(*(long *)(*(long *)(local_10 + 2) + 0x548) + (long)local_1c * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(local_10 + 2) + 0x548) + (long)local_1c * 8));
      }
      if (*(long *)(*(long *)(*(long *)(local_10 + 2) + 0x550) + (long)local_1c * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(local_10 + 2) + 0x550) + (long)local_1c * 8));
      }
    }
    free(*(void **)(*(long *)(local_10 + 2) + 0x558));
    free(*(void **)(*(long *)(local_10 + 2) + 0x540));
    free(*(void **)(*(long *)(local_10 + 2) + 0x538));
    free(*(void **)(*(long *)(local_10 + 2) + 0x550));
    free(*(void **)(*(long *)(local_10 + 2) + 0x548));
    free(*(void **)(*(long *)(local_10 + 2) + 0x530));
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x558) = 0;
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x540) = 0;
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x538) = 0;
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x550) = 0;
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x548) = 0;
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x530) = 0;
  }
  if (*(long *)(*(long *)(local_10 + 2) + 0x3d0) != 0) {
    free(*(void **)(*(long *)(local_10 + 2) + 0x3d0));
  }
  if ((0 < (long)local_30) &&
     (local_58 = (undefined1 *)calloc(local_30,0xa0), local_58 == (undefined1 *)0x0)) {
    ffpmsg((char *)0x16c648);
    *(undefined8 *)(*(long *)(local_10 + 2) + 0x3d0) = 0;
    *local_18 = 0x6f;
    return 0x6f;
  }
  *(undefined1 **)(*(long *)(local_10 + 2) + 0x3d0) = local_58;
  for (local_1c = 0; (long)local_1c < (long)local_30; local_1c = local_1c + 1) {
    *local_58 = 0;
    *(undefined8 *)(local_58 + 0x60) = 0x3ff0000000000000;
    *(undefined8 *)(local_58 + 0x68) = 0;
    local_58[0x78] = 1;
    *(undefined8 *)(local_58 + 0x48) = 0xffffffffffffffff;
    *(undefined4 *)(local_58 + 0x50) = 0xffffd8f1;
    local_58 = local_58 + 0xa0;
  }
  *(long *)(*(long *)(local_10 + 2) + 0x3c0) = local_48;
  *(long *)(*(long *)(local_10 + 2) + 0x3b8) = local_48;
  *(long *)(*(long *)(local_10 + 2) + 0x3d8) = local_40 * local_48;
  *(undefined8 *)(*(long *)(local_10 + 2) + 0x3e0) = 0;
  *(undefined4 *)(*(long *)(local_10 + 2) + 0x47c) = 0;
  local_20 = 0;
  local_1c = 8;
  do {
    ffgkyn(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
           in_stack_fffffffffffffec0,
           (char *)CONCAT71(in_stack_fffffffffffffeb9,in_stack_fffffffffffffeb8),
           in_stack_fffffffffffffeb0);
    if (*local_18 == 0xcd) {
      strcat(local_f8,"\'");
      *local_18 = 0;
    }
    else if (*local_18 == 0xcf) {
      *local_18 = 0;
    }
    if (*local_18 == 0x6b) {
      ffpmsg((char *)0x16c88b);
      *local_18 = 0xd2;
      return 0xd2;
    }
    if (0 < *local_18) {
      return *local_18;
    }
    if (local_a8[0] == 'T') {
      ffgtbp(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
    }
    else if ((('D' < local_a8[0]) && (local_a8[0] < 'F')) &&
            (iVar1 = strcmp(local_a8,"END"), iVar1 == 0)) {
      local_58 = *(undefined1 **)(*(long *)(local_10 + 2) + 0x3d0);
      local_1c = 0;
      while( true ) {
        if ((long)local_30 <= (long)local_1c) {
          *(long *)(*(long *)(local_10 + 2) + 0x70) =
               *(long *)(*(long *)(local_10 + 2) + 0x80) - (long)((local_20 + 1) * 0x50);
          *(long *)(*(long *)(local_10 + 2) + 0x88) =
               ((*(long *)(*(long *)(local_10 + 2) + 0x80) + -0x50) / 0xb40 + 1) * 0xb40;
          *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                   (long)(*(int *)(*(long *)(local_10 + 2) + 0x54) + 1) * 8) =
               *(long *)(*(long *)(local_10 + 2) + 0x88) +
               ((local_40 * local_48 + 0xb3f) / 0xb40) * 0xb40;
          *(undefined8 *)(*(long *)(local_10 + 2) + 0x80) =
               *(undefined8 *)
                (*(long *)(*(long *)(local_10 + 2) + 0x68) +
                (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8);
          return *local_18;
        }
        local_50 = *(long *)((long)local_58 + 0x48);
        if (*(int *)((long)local_58 + 0x50) == -9999) {
          ffkeyn(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
          snprintf(&stack0xfffffffffffffe58,0x51,"Required %s keyword not found (ffainit).",local_a8
                  );
          ffpmsg((char *)0x16ca5c);
          *local_18 = 0xe8;
          return 0xe8;
        }
        if (local_50 == -1) {
          ffkeyn(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10);
          snprintf(&stack0xfffffffffffffe58,0x51,"Required %s keyword not found (ffainit).",local_a8
                  );
          ffpmsg((char *)0x16cad5);
          *local_18 = 0xe7;
          return 0xe7;
        }
        if ((*(long *)(*(long *)(local_10 + 2) + 0x3c8) != 0) &&
           ((local_50 < 0 || (*(long *)(*(long *)(local_10 + 2) + 0x3c8) <= local_50)))) break;
        if ((*(long *)(*(long *)(local_10 + 2) + 0x3c8) != 0) &&
           (*(long *)(*(long *)(local_10 + 2) + 0x3c8) < local_50 + *(long *)((long)local_58 + 0x98)
           )) {
          snprintf(&stack0xfffffffffffffe58,0x51,"Column %d is too wide to fit in table (ffainit)",
                   (ulong)(local_1c + 1));
          ffpmsg((char *)0x16cc21);
          snprintf(&stack0xfffffffffffffe58,0x51," TFORM = %s and NAXIS1 = %ld",
                   (long)local_58 + 0x8c,*(undefined8 *)(*(long *)(local_10 + 2) + 0x3c8));
          ffpmsg((char *)0x16cc65);
          *local_18 = 0xec;
          return 0xec;
        }
        local_1c = local_1c + 1;
        local_58 = (undefined1 *)((long)local_58 + 0xa0);
      }
      ffkeyn(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
      snprintf(&stack0xfffffffffffffe58,0x51,"Value of %s keyword out of range: %ld (ffainit).",
               local_a8,local_50);
      ffpmsg((char *)0x16cb8d);
      *local_18 = 0xea;
      return 0xea;
    }
    if (((local_a8[0] == '\0') && (local_f8[0] == '\0')) && (in_stack_fffffffffffffeb8 == '\0')) {
      local_20 = local_20 + 1;
    }
    else {
      local_20 = 0;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int ffainit(fitsfile *fptr,      /* I - FITS file pointer */
            int *status)         /* IO - error status     */
{
/*
  initialize the parameters defining the structure of an ASCII table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, tbcoln;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG], errmsg[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* set that this is an ASCII table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is a valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)  
       return(*status);

    if (pcount != 0)
    {
       ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
       snprintf(errmsg, FLEN_ERRMSG,"  PCOUNT = %ld", (long) pcount);
       ffpmsg(errmsg);
       return(*status = BAD_PCOUNT);
    }

    (fptr->Fptr)->rowlength = rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0 */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffainit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /*  initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->strnull[0] = ASCII_NULL_UNDEFINED;  /* null value undefined */
        colptr->tbcol = -1;          /* initialize to illegal value */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
    }

    /*
      Initialize the fictitious heap starting address (immediately following
      the table data) and a zero length heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
      There is no special data following an ASCII table.
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in ASCII table header (ffainit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;

        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0;
    }

    /* test that all required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        tbcoln = colptr->tbcol;  /* the starting column number (zero based) */

        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }

        else if (tbcoln == -1)
        {
            ffkeyn("TBCOL", ii+1, name, status); /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                (tbcoln < 0 || tbcoln >= (fptr->Fptr)->rowlength ) )
        {
            ffkeyn("TBCOL", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Value of %s keyword out of range: %ld (ffainit).",
            name, (long) tbcoln);
            ffpmsg(message);
            return(*status = BAD_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                 tbcoln + colptr->twidth > (fptr->Fptr)->rowlength )
        {
            snprintf(message,FLEN_ERRMSG,"Column %d is too wide to fit in table (ffainit)",
            ii+1);
            ffpmsg(message);
            snprintf(message, FLEN_ERRMSG," TFORM = %s and NAXIS1 = %ld",
                    colptr->tform, (long) (fptr->Fptr)->rowlength);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart +
         ( ((LONGLONG)rowlen * nrows + 2879) / 2880 * 2880 );

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}